

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

FuncNode * __thiscall asmjit::v1_14::BaseCompiler::addFunc(BaseCompiler *this,FuncNode *func)

{
  BaseNode *pBVar1;
  FuncNode *in_RSI;
  BaseBuilder *in_RDI;
  BaseNode *prev;
  BaseBuilder *node;
  BaseBuilder *in_stack_ffffffffffffffd8;
  BaseBuilder *this_00;
  
  in_RDI[1].super_BaseEmitter._vptr_BaseEmitter = (_func_int **)in_RSI;
  node = in_RDI;
  BaseBuilder::addNode(in_stack_ffffffffffffffd8,(BaseNode *)in_RDI);
  pBVar1 = in_RDI->_cursor;
  this_00 = in_RDI;
  BaseBuilder::addNode(in_RDI,(BaseNode *)node);
  BaseBuilder::addNode(this_00,(BaseNode *)node);
  in_RDI->_cursor = pBVar1;
  return in_RSI;
}

Assistant:

FuncNode* BaseCompiler::addFunc(FuncNode* func) {
  _func = func;

  addNode(func);                 // Function node.
  BaseNode* prev = cursor();     // {CURSOR}.
  addNode(func->exitNode());     // Function exit label.
  addNode(func->endNode());      // Function end sentinel.

  _setCursor(prev);
  return func;
}